

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

bool __thiscall
iDynTree::InverseKinematics::getPoseForFrame
          (InverseKinematics *this,string *frameName,MatrixView<double> *transform)

{
  if ((transform->m_rows == 4) && (transform->m_cols == 4)) {
    missingIpoptErrorReport();
  }
  else {
    iDynTree::reportError
              ("InverseKinematics","getPoseForFrame","Invalid size of the transform matrix");
  }
  return false;
}

Assistant:

bool InverseKinematics::getPoseForFrame(const std::string& frameName,
                                            iDynTree::MatrixView<double> transform)
    {
        constexpr int expected_transform_cols = 4;
        constexpr int expected_transform_rows = 4;
        const bool ok = (transform.rows() == expected_transform_rows)
            && (transform.cols() == expected_transform_cols);
        if (!ok)
        {
            reportError("InverseKinematics",
                        "getPoseForFrame",
                        "Invalid size of the transform matrix");
            return false;
        }

#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        toEigen(transform) = toEigen(IK_PIMPL(m_pimpl)->dynamics().getWorldTransform(frameName).asHomogeneousTransform());
        return true;
#else
        return missingIpoptErrorReport();
#endif
    }